

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
write_exponent<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
          (int exp,back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> it)

{
  type tVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> *pbVar2;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_88;
  value_type_conflict3 local_7a;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_78;
  value_type_conflict3 local_6a;
  char *local_68;
  char *d;
  value_type_conflict3 local_52;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_50;
  value_type_conflict3 local_42;
  char *local_40;
  char *top;
  value_type_conflict3 local_2a;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_28;
  value_type_conflict3 local_1e;
  int local_1c;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bStack_18;
  int exp_local;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> it_local;
  
  local_1c = exp;
  bStack_18.container = it.container;
  if ((-10000 < exp) && (exp < 10000)) {
    if (exp < 0) {
      local_1e = L'-';
      local_28 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator++
                           (&stack0xffffffffffffffe8,0);
      pbVar2 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator*(&local_28);
      std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator=(pbVar2,&local_1e);
      local_1c = -local_1c;
    }
    else {
      local_2a = L'+';
      top = (char *)std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator++
                              (&stack0xffffffffffffffe8,0);
      pbVar2 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator*
                         ((back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> *)&top);
      std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator=(pbVar2,&local_2a);
    }
    if (99 < local_1c) {
      tVar1 = to_unsigned<int>(local_1c / 100);
      local_40 = digits2((ulong)tVar1);
      if (999 < local_1c) {
        local_42 = (value_type_conflict3)*local_40;
        local_50 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator++
                             (&stack0xffffffffffffffe8,0);
        pbVar2 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator*(&local_50)
        ;
        std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator=(pbVar2,&local_42);
      }
      local_52 = (value_type_conflict3)local_40[1];
      d = (char *)std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator++
                            (&stack0xffffffffffffffe8,0);
      pbVar2 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator*
                         ((back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> *)&d);
      std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator=(pbVar2,&local_52);
      local_1c = local_1c % 100;
    }
    tVar1 = to_unsigned<int>(local_1c);
    local_68 = digits2((ulong)tVar1);
    local_6a = (value_type_conflict3)*local_68;
    local_78 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator++
                         (&stack0xffffffffffffffe8,0);
    pbVar2 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator*(&local_78);
    std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator=(pbVar2,&local_6a);
    local_7a = (value_type_conflict3)local_68[1];
    local_88 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator++
                         (&stack0xffffffffffffffe8,0);
    pbVar2 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator*(&local_88);
    std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator=(pbVar2,&local_7a);
    return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bStack_18.container;
  }
  fmt::v8::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
             ,0x508,"exponent out of range");
}

Assistant:

FMT_CONSTEXPR auto write_exponent(int exp, It it) -> It {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = digits2(to_unsigned(exp / 100));
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = digits2(to_unsigned(exp));
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}